

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O2

double ON_CurveOrientationArea
                 (ON_Curve *curve,ON_Interval *domain,ON_Xform *xform,bool bReverseCurve)

{
  bool bVar1;
  int iVar2;
  double *pdVar3;
  double a;
  ON_Interval local_domain;
  ON_3dPoint start_point;
  double local_58;
  ON_Interval local_50;
  ON_3dPoint local_40;
  
  if (curve != (ON_Curve *)0x0) {
    (*(curve->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x25])();
    if (domain != (ON_Interval *)0x0) {
      bVar1 = ON_Interval::IsIncreasing(domain);
      if (bVar1) {
        ON_Interval::Intersection(&local_50,domain);
      }
    }
    pdVar3 = ON_Interval::operator[](&local_50,0);
    ON_Curve::PointAt(&local_40,curve,*pdVar3);
    local_58 = 0.0;
    iVar2 = curve_area(&local_40,curve,&local_50,xform,&local_58);
    if (iVar2 == 0) {
      local_58 = 0.0;
    }
    else if ((bReverseCurve) && ((local_58 != 0.0 || (NAN(local_58))))) {
      local_58 = -local_58;
    }
    return local_58;
  }
  return 0.0;
}

Assistant:

double ON_CurveOrientationArea( 
  const ON_Curve* curve,
  const ON_Interval* domain,
  const ON_Xform* xform,
  bool bReverseCurve
  )
{
  if ( 0 == curve )
    return 0.0;

  ON_Interval local_domain = curve->Domain();
  if ( 0 != domain && domain->IsIncreasing() )
    local_domain.Intersection(*domain);

  ON_3dPoint start_point = curve->PointAt(local_domain[0]);
  double a = 0.0;
  if ( !curve_area( start_point, curve, local_domain, xform, &a ) ) 
    a = 0.0;
  else if ( bReverseCurve && 0.0 != a )
    a = -a;

  return a;
}